

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O0

PAL_ERROR CorUnix::InternalUnlockFile
                    (CPalThread *pThread,HANDLE hFile,DWORD dwFileOffsetLow,DWORD dwFileOffsetHigh,
                    DWORD nNumberOfBytesToUnlockLow,DWORD nNumberOfBytesToUnlockHigh)

{
  undefined8 *local_48;
  IDataLock *pLocalDataLock;
  CFileProcessLocalData *pLocalData;
  IPalObject *pFileObject;
  DWORD local_28;
  PAL_ERROR palError;
  DWORD nNumberOfBytesToUnlockHigh_local;
  DWORD nNumberOfBytesToUnlockLow_local;
  DWORD dwFileOffsetHigh_local;
  DWORD dwFileOffsetLow_local;
  HANDLE hFile_local;
  CPalThread *pThread_local;
  
  pFileObject._4_4_ = 0;
  pLocalData = (CFileProcessLocalData *)0x0;
  pLocalDataLock = (IDataLock *)0x0;
  local_48 = (undefined8 *)0x0;
  local_28 = nNumberOfBytesToUnlockHigh;
  palError = nNumberOfBytesToUnlockLow;
  nNumberOfBytesToUnlockHigh_local = dwFileOffsetHigh;
  nNumberOfBytesToUnlockLow_local = dwFileOffsetLow;
  _dwFileOffsetHigh_local = hFile;
  hFile_local = pThread;
  if ((undefined1 *)hFile == &DAT_ffffffffffffffff) {
    if (!PAL_InitializeChakraCoreCalled) {
      abort();
    }
    pFileObject._4_4_ = 6;
  }
  else {
    pFileObject._4_4_ =
         (**(code **)(*g_pObjectManager + 0x28))
                   (g_pObjectManager,pThread,hFile,aotFile,0x80000000,&pLocalData);
    if ((pFileObject._4_4_ == 0) &&
       (pFileObject._4_4_ =
             (*(code *)pLocalData->pLockController[3]._vptr_IFileLockController)
                       (pLocalData,hFile_local,0,&local_48,&pLocalDataLock), pFileObject._4_4_ == 0)
       ) {
      if (pLocalDataLock->_vptr_IDataLock == (_func_int **)0x0) {
        pFileObject._4_4_ = 5;
      }
      else {
        pFileObject._4_4_ =
             (**(code **)(*pLocalDataLock->_vptr_IDataLock + 0x10))
                       (pLocalDataLock->_vptr_IDataLock,hFile_local,nNumberOfBytesToUnlockLow_local,
                        nNumberOfBytesToUnlockHigh_local,palError,local_28);
      }
    }
  }
  if (local_48 != (undefined8 *)0x0) {
    (**(code **)*local_48)(local_48,hFile_local,0);
  }
  if (pLocalData != (CFileProcessLocalData *)0x0) {
    (*(code *)pLocalData->pLockController[8]._vptr_IFileLockController)(pLocalData,hFile_local);
  }
  return pFileObject._4_4_;
}

Assistant:

PAL_ERROR
CorUnix::InternalUnlockFile(
    CPalThread *pThread,
    HANDLE hFile,
    DWORD dwFileOffsetLow,
    DWORD dwFileOffsetHigh,
    DWORD nNumberOfBytesToUnlockLow,
    DWORD nNumberOfBytesToUnlockHigh
    )
{
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pFileObject = NULL;
    CFileProcessLocalData *pLocalData = NULL;
    IDataLock *pLocalDataLock = NULL;

    if (INVALID_HANDLE_VALUE == hFile)
    {
        ERROR( "Invalid file handle\n" );
        palError = ERROR_INVALID_HANDLE;
        goto InternalUnlockFileExit;
    }

    palError = g_pObjectManager->ReferenceObjectByHandle(
        pThread,
        hFile,
        &aotFile,
        GENERIC_READ,
        &pFileObject
        );

    if (NO_ERROR != palError)
    {
        goto InternalUnlockFileExit;
    }

    palError = pFileObject->GetProcessLocalData(
        pThread,
        ReadLock, 
        &pLocalDataLock,
        reinterpret_cast<void**>(&pLocalData)
        );

    if (NO_ERROR != palError)
    {
        goto InternalUnlockFileExit;
    }
    
    if (NULL != pLocalData->pLockController)
    {
        palError = pLocalData->pLockController->ReleaseFileLock(
            pThread,
            dwFileOffsetLow,
            dwFileOffsetHigh,
            nNumberOfBytesToUnlockLow,
            nNumberOfBytesToUnlockHigh
            );
    }
    else
    {
        //
        // This isn't a lockable file (e.g., it may be a pipe)
        //
        
        palError = ERROR_ACCESS_DENIED;
        goto InternalUnlockFileExit;
    }

InternalUnlockFileExit:

    if (NULL != pLocalDataLock)
    {
        pLocalDataLock->ReleaseLock(pThread, FALSE);
    }

    if (NULL != pFileObject)
    {
        pFileObject->ReleaseReference(pThread);
    }

    return palError;
}